

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scrollbar.cxx
# Opt level: O0

void __thiscall Fl_Scrollbar::draw(Fl_Scrollbar *this)

{
  byte bVar1;
  int iVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Color FVar8;
  Fl_Boxtype local_a4;
  Fl_Boxtype local_8c;
  Fl_Boxtype local_6c;
  Fl_Boxtype local_54;
  int yy1_1;
  int x1_1;
  int w1_1;
  int yy1;
  int x1;
  int w1;
  int H;
  int W;
  int Y;
  int X;
  Fl_Scrollbar *this_local;
  
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0x80) != 0) {
    Fl_Widget::draw_box((Fl_Widget *)this);
  }
  iVar2 = Fl_Widget::x((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dx(FVar3);
  iVar2 = iVar2 + iVar4;
  iVar5 = Fl_Widget::y((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dy(FVar3);
  iVar5 = iVar5 + iVar4;
  iVar6 = Fl_Widget::w((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dw(FVar3);
  iVar6 = iVar6 - iVar4;
  iVar7 = Fl_Widget::h((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dh(FVar3);
  iVar7 = iVar7 - iVar4;
  iVar4 = Fl_Valuator::horizontal((Fl_Valuator *)this);
  if (iVar4 == 0) {
    if (SBORROW4(iVar7,iVar6 * 3) == iVar7 + iVar6 * -3 < 0) {
      Fl_Slider::draw(&this->super_Fl_Slider,iVar2,iVar5 + iVar6,iVar6,iVar7 + iVar6 * -2);
      bVar1 = Fl_Widget::damage((Fl_Widget *)this);
      if ((bVar1 & 0x80) != 0) {
        if (this->pushed_ == 1) {
          FVar3 = Fl_Slider::slider(&this->super_Fl_Slider);
          local_8c = fl_down(FVar3);
        }
        else {
          local_8c = Fl_Slider::slider(&this->super_Fl_Slider);
        }
        FVar8 = Fl_Widget::selection_color((Fl_Widget *)this);
        Fl_Widget::draw_box((Fl_Widget *)this,local_8c,iVar2,iVar5,iVar6,iVar6,FVar8);
        if (this->pushed_ == 2) {
          FVar3 = Fl_Slider::slider(&this->super_Fl_Slider);
          local_a4 = fl_down(FVar3);
        }
        else {
          local_a4 = Fl_Slider::slider(&this->super_Fl_Slider);
        }
        FVar8 = Fl_Widget::selection_color((Fl_Widget *)this);
        Fl_Widget::draw_box((Fl_Widget *)this,local_a4,iVar2,(iVar5 + iVar7) - iVar6,iVar6,iVar6,
                            FVar8);
        iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
        if (iVar4 == 0) {
          FVar8 = Fl_Widget::labelcolor((Fl_Widget *)this);
          FVar8 = fl_inactive(FVar8);
          fl_color(FVar8);
        }
        else {
          FVar8 = Fl_Widget::labelcolor((Fl_Widget *)this);
          fl_color(FVar8);
        }
        yy1_1 = (iVar6 + -4) / 3;
        if (yy1_1 < 1) {
          yy1_1 = 1;
        }
        iVar2 = iVar2 + (iVar6 + yy1_1 * -2 + -1) / 2;
        iVar5 = iVar5 + ((iVar6 - yy1_1) + -1) / 2;
        iVar4 = Fl::is_scheme("gtk+");
        if (iVar4 == 0) {
          fl_polygon(iVar2,iVar5 + yy1_1,iVar2 + yy1_1 * 2,iVar5 + yy1_1,iVar2 + yy1_1,iVar5);
          iVar5 = (iVar7 - iVar6) + iVar5;
          fl_polygon(iVar2,iVar5,iVar2 + yy1_1,iVar5 + yy1_1,iVar2 + yy1_1 * 2,iVar5);
        }
        else {
          fl_polygon(iVar2,iVar5 + yy1_1,iVar2 + yy1_1,iVar5 + yy1_1 + -1,iVar2 + yy1_1 * 2,
                     iVar5 + yy1_1,iVar2 + yy1_1,iVar5);
          iVar5 = (iVar7 - iVar6) + iVar5;
          fl_polygon(iVar2,iVar5,iVar2 + yy1_1,iVar5 + 1,iVar2 + yy1_1,iVar5 + yy1_1);
          fl_polygon(iVar2 + yy1_1,iVar5 + 1,iVar2 + yy1_1 * 2,iVar5,iVar2 + yy1_1,iVar5 + yy1_1);
        }
      }
    }
    else {
      Fl_Slider::draw(&this->super_Fl_Slider,iVar2,iVar5,iVar6,iVar7);
    }
  }
  else if (SBORROW4(iVar6,iVar7 * 3) == iVar6 + iVar7 * -3 < 0) {
    Fl_Slider::draw(&this->super_Fl_Slider,iVar2 + iVar7,iVar5,iVar6 + iVar7 * -2,iVar7);
    bVar1 = Fl_Widget::damage((Fl_Widget *)this);
    if ((bVar1 & 0x80) != 0) {
      if (this->pushed_ == 1) {
        FVar3 = Fl_Slider::slider(&this->super_Fl_Slider);
        local_54 = fl_down(FVar3);
      }
      else {
        local_54 = Fl_Slider::slider(&this->super_Fl_Slider);
      }
      FVar8 = Fl_Widget::selection_color((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,local_54,iVar2,iVar5,iVar7,iVar7,FVar8);
      if (this->pushed_ == 2) {
        FVar3 = Fl_Slider::slider(&this->super_Fl_Slider);
        local_6c = fl_down(FVar3);
      }
      else {
        local_6c = Fl_Slider::slider(&this->super_Fl_Slider);
      }
      FVar8 = Fl_Widget::selection_color((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,local_6c,(iVar2 + iVar6) - iVar7,iVar5,iVar7,iVar7,FVar8
                         );
      iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
      if (iVar4 == 0) {
        FVar8 = Fl_Widget::labelcolor((Fl_Widget *)this);
        FVar8 = fl_inactive(FVar8);
        fl_color(FVar8);
      }
      else {
        FVar8 = Fl_Widget::labelcolor((Fl_Widget *)this);
        fl_color(FVar8);
      }
      yy1 = (iVar7 + -4) / 3;
      if (yy1 < 1) {
        yy1 = 1;
      }
      iVar2 = iVar2 + ((iVar7 - yy1) + -1) / 2;
      iVar5 = iVar5 + (iVar7 + yy1 * -2 + -1) / 2;
      iVar4 = Fl::is_scheme("gtk+");
      if (iVar4 == 0) {
        fl_polygon(iVar2,iVar5 + yy1,iVar2 + yy1,iVar5 + yy1 * 2,iVar2 + yy1,iVar5);
        iVar2 = (iVar6 - iVar7) + iVar2;
        fl_polygon(iVar2,iVar5,iVar2,iVar5 + yy1 * 2,iVar2 + yy1,iVar5 + yy1);
      }
      else {
        fl_polygon(iVar2,iVar5 + yy1,iVar2 + yy1,iVar5 + yy1 * 2,iVar2 + yy1 + -1,iVar5 + yy1,
                   iVar2 + yy1,iVar5);
        iVar2 = (iVar6 - iVar7) + iVar2;
        fl_polygon(iVar2,iVar5,iVar2 + 1,iVar5 + yy1,iVar2,iVar5 + yy1 * 2,iVar2 + yy1,iVar5 + yy1);
      }
    }
  }
  else {
    Fl_Slider::draw(&this->super_Fl_Slider,iVar2,iVar5,iVar6,iVar7);
  }
  return;
}

Assistant:

void Fl_Scrollbar::draw() {
  if (damage()&FL_DAMAGE_ALL) draw_box();
  int X = x()+Fl::box_dx(box());
  int Y = y()+Fl::box_dy(box());
  int W = w()-Fl::box_dw(box());
  int H = h()-Fl::box_dh(box());
  if (horizontal()) {
    if (W < 3*H) {Fl_Slider::draw(X,Y,W,H); return;}
    Fl_Slider::draw(X+H,Y,W-2*H,H);
    if (damage()&FL_DAMAGE_ALL) {
      draw_box((pushed_==1) ? fl_down(slider()) : slider(),
	       X, Y, H, H, selection_color());
      draw_box((pushed_==2) ? fl_down(slider()) : slider(),
	       X+W-H, Y, H, H, selection_color());
      if (active_r())
        fl_color(labelcolor());
      else
        fl_color(fl_inactive(labelcolor()));
      int w1 = (H-4)/3; if (w1 < 1) w1 = 1;
      int x1 = X+(H-w1-1)/2;
      int yy1 = Y+(H-2*w1-1)/2;
      if (Fl::is_scheme("gtk+")) {
	fl_polygon(x1, yy1+w1, x1+w1, yy1+2*w1, x1+w1-1, yy1+w1, x1+w1, yy1);
	x1 += (W-H);
	fl_polygon(x1, yy1, x1+1, yy1+w1, x1, yy1+2*w1, x1+w1, yy1+w1);
      } else {
	fl_polygon(x1, yy1+w1, x1+w1, yy1+2*w1, x1+w1, yy1);
	x1 += (W-H);
	fl_polygon(x1, yy1, x1, yy1+2*w1, x1+w1, yy1+w1);
      }
    }
  } else { // vertical
    if (H < 3*W) {Fl_Slider::draw(X,Y,W,H); return;}
    Fl_Slider::draw(X,Y+W,W,H-2*W);
    if (damage()&FL_DAMAGE_ALL) {
      draw_box((pushed_==1) ? fl_down(slider()) : slider(),
	       X, Y, W, W, selection_color());
      draw_box((pushed_==2) ? fl_down(slider()) : slider(),
	       X, Y+H-W, W, W, selection_color());
      if (active_r())
        fl_color(labelcolor());
      else
        fl_color(fl_inactive(labelcolor()));
      int w1 = (W-4)/3; if (w1 < 1) w1 = 1;
      int x1 = X+(W-2*w1-1)/2;
      int yy1 = Y+(W-w1-1)/2;
      if (Fl::is_scheme("gtk+")) {
	fl_polygon(x1, yy1+w1, x1+w1, yy1+w1-1, x1+2*w1, yy1+w1, x1+w1, yy1);
	yy1 += H-W;
	fl_polygon(x1, yy1, x1+w1, yy1+1, x1+w1, yy1+w1);
	fl_polygon(x1+w1, yy1+1, x1+2*w1, yy1, x1+w1, yy1+w1);
      } else {
	fl_polygon(x1, yy1+w1, x1+2*w1, yy1+w1, x1+w1, yy1);
	yy1 += H-W;
	fl_polygon(x1, yy1, x1+w1, yy1+w1, x1+2*w1, yy1);
      }
    }
  }
}